

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall CPU::MOS6502::State::Registers::Registers(Registers *this)

{
  allocator<char> local_29;
  string local_28;
  
  (this->super_StructImpl<CPU::MOS6502::State::Registers>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058da40;
  if (Reflection::StructImpl<CPU::MOS6502::State::Registers>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"program_counter",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->program_counter,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"stack_pointer",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->stack_pointer,
               &local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"flags",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->flags,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"a",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->a,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"x",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->x,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"y",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->y,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

State::Registers::Registers() {
	if(needs_declare()) {
		DeclareField(program_counter);
		DeclareField(stack_pointer);
		DeclareField(flags);
		DeclareField(a);
		DeclareField(x);
		DeclareField(y);
	}
}